

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_polygon_mesh.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::SimplePolygonMesh::writeMeshObj(SimplePolygonMesh *this,ostream *out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer pVVar4;
  pointer pvVar5;
  pointer pVVar6;
  pointer pvVar7;
  pointer puVar8;
  ostream *poVar9;
  pointer pvVar10;
  pointer pVVar11;
  pointer puVar12;
  pointer pvVar13;
  pointer pVVar14;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *__range2;
  
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 0x11;
  poVar9 = ::std::operator<<((ostream *)out,"# Mesh exported from geometry-central");
  ::std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = ::std::operator<<((ostream *)out,"#  vertices: ");
  poVar9 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  ::std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = ::std::operator<<((ostream *)out,"#     faces: ");
  poVar9 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  ::std::endl<char,std::char_traits<char>>(poVar9);
  ::std::endl<char,std::char_traits<char>>((ostream *)out);
  pVVar4 = (this->vertexCoordinates).
           super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pVVar14 = (this->vertexCoordinates).
                 super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                 ._M_impl.super__Vector_impl_data._M_start; pVVar14 != pVVar4; pVVar14 = pVVar14 + 1
      ) {
    dVar1 = pVVar14->x;
    dVar2 = pVVar14->y;
    dVar3 = pVVar14->z;
    ::std::operator<<((ostream *)out,"v ");
    poVar9 = ::std::ostream::_M_insert<double>(dVar1);
    ::std::operator<<(poVar9," ");
    poVar9 = ::std::ostream::_M_insert<double>(dVar2);
    ::std::operator<<(poVar9," ");
    poVar9 = ::std::ostream::_M_insert<double>(dVar3);
    ::std::endl<char,std::char_traits<char>>(poVar9);
  }
  pvVar5 = (this->paramCoordinates).
           super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar10 = (this->paramCoordinates).
                 super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar10 != pvVar5; pvVar10 = pvVar10 + 1
      ) {
    pVVar6 = (pvVar10->
             super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pVVar11 = (pvVar10->
                   super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                   )._M_impl.super__Vector_impl_data._M_start; pVVar11 != pVVar6;
        pVVar11 = pVVar11 + 1) {
      dVar1 = pVVar11->x;
      dVar2 = pVVar11->y;
      ::std::operator<<((ostream *)out,"vt ");
      poVar9 = ::std::ostream::_M_insert<double>(dVar1);
      ::std::operator<<(poVar9," ");
      poVar9 = ::std::ostream::_M_insert<double>(dVar2);
      ::std::endl<char,std::char_traits<char>>(poVar9);
    }
  }
  pvVar7 = (this->polygons).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar13 = (this->polygons).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar13 != pvVar7; pvVar13 = pvVar13 + 1
      ) {
    ::std::operator<<((ostream *)out,"f");
    puVar8 = (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar12 = (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start; puVar12 != puVar8;
        puVar12 = puVar12 + 1) {
      poVar9 = ::std::operator<<((ostream *)out," ");
      ::std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      if ((this->paramCoordinates).
          super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->paramCoordinates).
          super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        poVar9 = ::std::operator<<((ostream *)out,"/");
        ::std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      }
    }
    ::std::endl<char,std::char_traits<char>>((ostream *)out);
  }
  return;
}

Assistant:

void SimplePolygonMesh::writeMeshObj(std::ostream& out) {

  // Make sure we write out at full precision
  out << std::setprecision(std::numeric_limits<double>::max_digits10);

  // Write header
  out << "# Mesh exported from geometry-central" << std::endl;
  out << "#  vertices: " << vertexCoordinates.size() << std::endl;
  out << "#     faces: " << polygons.size() << std::endl;
  out << std::endl;

  // Write vertices
  for (Vector3 p : vertexCoordinates) {
    out << "v " << p.x << " " << p.y << " " << p.z << std::endl;
  }


  // Write texture coords (if present)
  for (std::vector<Vector2>& coords : paramCoordinates) {
    for (Vector2 c : coords) {
      out << "vt " << c.x << " " << c.y << std::endl;
    }
  }

  // Write faces
  size_t iC = 0;
  for (std::vector<size_t>& face : polygons) {
    out << "f";
    for (size_t ind : face) {
      out << " " << (ind + 1);

      if (!paramCoordinates.empty()) {
        out << "/" << (iC + 1);
        iC++;
      }
    }
    out << std::endl;
  }
}